

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O1

void math::internal::matrix_bidiagonalize<double>
               (double *mat_a,int rows,int cols,double *mat_u,double *mat_b,double *mat_v,
               double *epsilon)

{
  size_t __n;
  size_t __n_00;
  undefined1 auVar1 [8];
  int iVar2;
  uint uVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  double *pdVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  undefined4 in_register_00000014;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int length;
  long lVar20;
  uint uVar21;
  int iVar22;
  undefined4 in_register_00000034;
  ulong uVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  undefined1 local_1c8 [8];
  vector<double,_std::allocator<double>_> buffer;
  double house_beta;
  undefined1 local_178 [8];
  vector<double,_std::allocator<double>_> buffer2;
  double inner_house_beta;
  long local_150;
  double *local_130;
  long local_128;
  long local_120;
  ulong local_110;
  long local_d0;
  ulong local_c8;
  long local_c0;
  int local_98;
  long local_88;
  uint local_7c;
  int local_74;
  double local_70;
  double *local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  double *local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar15;
  
  local_40 = CONCAT44(in_register_00000034,rows);
  local_38 = CONCAT44(in_register_00000014,cols);
  local_68 = mat_a;
  if (rows != 0) {
    lVar28 = 0;
    memset(mat_u,0,(ulong)(uint)(rows * rows) * 8);
    do {
      mat_u[lVar28] = 1.0;
      lVar28 = lVar28 + ((int)local_40 + 1);
    } while (lVar28 < rows * rows);
  }
  if ((int)local_38 != 0) {
    uVar17 = (int)local_38 * (int)local_38;
    lVar28 = 0;
    memset(mat_v,0,(ulong)uVar17 * 8);
    do {
      mat_v[lVar28] = 1.0;
      lVar28 = lVar28 + ((int)local_38 + 1);
    } while (lVar28 < (int)uVar17);
  }
  iVar2 = (int)local_38 * (int)local_40;
  if (iVar2 != 0) {
    memmove(mat_b,local_68,(long)iVar2 << 3);
  }
  iVar2 = (int)local_38;
  uVar17 = iVar2 - (uint)((int)local_40 == iVar2);
  if (0 < (int)uVar17) {
    uVar13 = (int)local_40 * (int)local_40;
    uVar21 = iVar2 * iVar2;
    lVar28 = (long)iVar2;
    lVar24 = (long)(int)local_40;
    local_120 = lVar24 << 4;
    iVar25 = iVar2 + -1;
    local_c0 = lVar28 * 0x10;
    local_74 = (int)local_40 * iVar25;
    iVar18 = (2 - iVar2) - (int)local_40;
    iVar26 = iVar2 * -2 + 3;
    local_60 = CONCAT44(local_60._4_4_,iVar25);
    local_7c = iVar25 * iVar25;
    uVar3 = (int)local_40 + 1;
    __n = (ulong)uVar13 * 8;
    __n_00 = (ulong)uVar21 * 8;
    uVar14 = iVar2 + 1;
    uVar15 = (ulong)uVar14;
    uVar4 = local_40 & 0xffffffff;
    local_68 = (double *)(local_38 & 0xffffffff);
    local_130 = mat_b + lVar28;
    local_128 = lVar24 * 8;
    local_150 = lVar28 * 8;
    local_88 = 1;
    local_d0 = 0;
    pdVar5 = (double *)0x0;
    local_c8 = 1;
    pdVar9 = mat_b;
    uVar29 = local_40;
    local_110 = uVar15;
    local_50 = (ulong)local_68;
    do {
      local_c0 = local_c0 + -0x10;
      local_150 = local_150 + -8;
      uVar12 = uVar29 & 0xffffffff;
      lVar27 = lVar24 - (long)pdVar5;
      iVar25 = (int)lVar27;
      local_48 = pdVar5;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_1c8,
                 (long)(int)((iVar25 + 2) * iVar25 + uVar13 * 2),(allocator_type *)local_178);
      auVar1 = local_1c8;
      if (0 < lVar27) {
        uVar10 = 0;
        pdVar5 = pdVar9;
        do {
          *(double *)((long)local_1c8 + uVar10 * 8) = *pdVar5;
          uVar10 = uVar10 + 1;
          pdVar5 = pdVar5 + lVar28;
        } while (uVar12 != uVar10);
      }
      pdVar5 = (double *)((long)local_1c8 + lVar27 * 8);
      pdVar6 = pdVar5 + lVar27;
      local_178 = (undefined1  [8])&DAT_3ff0000000000000;
      matrix_householder_vector<double>
                ((double *)local_1c8,iVar25,pdVar5,
                 (double *)
                 &buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,epsilon,(double *)local_178);
      local_58 = lVar27;
      matrix_householder_matrix<double>
                (pdVar5,iVar25,
                 (double)buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,pdVar6);
      iVar25 = (int)local_48;
      matrix_apply_householder_matrix<double>
                (mat_b,(int)local_40,(int)local_38,pdVar6,(int)local_40 - iVar25,iVar25,iVar25);
      pdVar5 = (double *)((long)local_48 + 1);
      uVar10 = uVar4;
      pdVar11 = local_130;
      if ((long)pdVar5 < lVar24) {
        do {
          *pdVar11 = 0.0;
          pdVar11 = pdVar11 + lVar28;
          uVar10 = uVar10 - 1;
        } while (local_c8 != uVar10);
      }
      pdVar6 = pdVar6 + (uint)((int)local_58 * (int)local_58);
      if ((int)local_40 != 0) {
        memset(pdVar6,0,__n);
      }
      if (local_48 != (double *)0x0) {
        iVar25 = 0;
        pdVar11 = local_48;
        do {
          pdVar6[iVar25] = 1.0;
          iVar25 = iVar25 + uVar3;
          pdVar11 = (double *)((long)pdVar11 + -1);
        } while (pdVar11 != (double *)0x0);
      }
      if (0 < local_58) {
        lVar20 = (long)auVar1 + local_120;
        uVar10 = 0;
        lVar27 = local_d0;
        do {
          uVar16 = 0;
          do {
            pdVar6[(int)lVar27 + (int)uVar16] = *(double *)(lVar20 + uVar16 * 8);
            uVar16 = uVar16 + 1;
          } while (uVar12 != uVar16);
          uVar10 = uVar10 + 1;
          lVar20 = lVar20 + local_128;
          lVar27 = lVar27 + uVar4;
        } while (uVar10 != uVar12);
      }
      if ((int)local_40 != 0) {
        memmove(pdVar6 + uVar13,mat_u,__n);
      }
      iVar25 = (int)local_40;
      matrix_multiply<double>(pdVar6 + uVar13,iVar25,iVar25,pdVar6,iVar25,mat_u);
      iVar25 = (int)local_60;
      uVar16 = local_60 & 0xffffffff;
      uVar10 = local_50 - 1;
      if ((long)local_48 <= (long)(iVar2 + -3)) {
        local_70 = 0.0;
        if ((long)pdVar5 < lVar28) {
          uVar7 = 1;
          local_70 = 0.0;
          do {
            local_70 = local_70 + pdVar9[uVar7];
            uVar7 = uVar7 + 1;
          } while (local_50 != uVar7);
        }
        if ((0.0 - *epsilon <= local_70) && (local_70 <= *epsilon)) {
          local_70 = 1.0;
        }
        local_50 = lVar28 - (long)pdVar5;
        iVar19 = ~(uint)local_48 + (int)local_38;
        iVar22 = (int)local_58 * iVar19;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_178,
                   (long)(int)(((int)local_50 + 2) * (int)local_50 + (uVar21 + iVar22) * 2),
                   (allocator_type *)
                   &buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        auVar1 = local_178;
        if (0 < iVar19) {
          uVar7 = 0;
          do {
            *(double *)((long)local_178 + uVar7 * 8) = mat_b[(int)local_88 + (int)uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar16 != uVar7);
        }
        pdVar6 = (double *)((long)local_178 + local_50 * 8);
        pdVar11 = pdVar6 + local_50;
        length = (int)local_50;
        matrix_householder_vector<double>
                  ((double *)local_178,length,pdVar6,
                   (double *)
                   &buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,epsilon,&local_70);
        matrix_householder_matrix<double>
                  (pdVar6,length,
                   (double)buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,pdVar11);
        lVar27 = local_c0 + (ulong)local_7c * 8;
        local_60 = (long)(int)local_60 * 8;
        if (0 < local_58) {
          lVar8 = lVar27 + (long)local_74 * 8 + (long)auVar1;
          uVar7 = 0;
          lVar20 = local_88;
          do {
            if (0 < iVar19) {
              uVar23 = 0;
              do {
                *(double *)(lVar8 + uVar23 * 8) = mat_b[(int)lVar20 + (int)uVar23];
                uVar23 = uVar23 + 1;
              } while (uVar16 != uVar23);
            }
            uVar7 = uVar7 + 1;
            lVar8 = lVar8 + local_60;
            lVar20 = lVar20 + (long)local_68;
          } while (uVar7 != uVar12);
        }
        local_98 = (int)pdVar5;
        pdVar6 = pdVar11 + (uint)((int)local_50 * (int)local_50);
        matrix_multiply<double>
                  (pdVar6 + iVar22,(int)local_58,iVar19,pdVar11,(int)local_38 - local_98,pdVar6);
        if (0 < local_58) {
          lVar27 = lVar27 + (long)auVar1;
          uVar7 = 0;
          lVar20 = local_88;
          do {
            if (0 < iVar19) {
              uVar23 = 0;
              do {
                mat_b[(int)lVar20 + (int)uVar23] = *(double *)(lVar27 + uVar23 * 8);
                uVar23 = uVar23 + 1;
              } while (uVar16 != uVar23);
            }
            uVar7 = uVar7 + 1;
            lVar27 = lVar27 + local_60;
            lVar20 = lVar20 + (long)local_68;
          } while (uVar7 != uVar12);
        }
        if ((long)local_48 < lVar28 + -2) {
          memset(mat_b + (int)(uVar14 * (int)local_48 + 2),0,
                 (ulong)(uint)((iVar2 + -3) - (int)local_48) * 8 + 8);
        }
        pdVar6 = pdVar6 + iVar22 + iVar22;
        if ((int)local_38 != 0) {
          memset(pdVar6,0,__n_00);
        }
        pdVar11 = pdVar6 + uVar21;
        iVar19 = 0;
        uVar12 = local_c8;
        do {
          pdVar6[iVar19] = 1.0;
          iVar19 = iVar19 + uVar14;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        if (0 < (long)local_50) {
          lVar27 = (long)auVar1 + local_c0;
          uVar7 = 0;
          uVar12 = local_110;
          do {
            uVar23 = 0;
            do {
              pdVar6[(int)uVar12 + (int)uVar23] = *(double *)(lVar27 + uVar23 * 8);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
            uVar7 = uVar7 + 1;
            lVar27 = lVar27 + local_150;
            uVar12 = uVar12 + (long)local_68;
          } while (uVar7 != (uVar10 & 0xffffffff));
        }
        if ((int)local_38 != 0) {
          local_48 = pdVar11;
          memmove(pdVar11,mat_v,__n_00);
          pdVar11 = local_48;
        }
        iVar19 = (int)local_38;
        matrix_multiply<double>(pdVar11,iVar19,iVar19,pdVar6,iVar19,mat_v);
        if (local_178 != (undefined1  [8])0x0) {
          operator_delete((void *)local_178);
        }
      }
      if (local_1c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1c8);
      }
      uVar29 = (ulong)((int)uVar29 - 1);
      local_c8 = local_c8 + 1;
      pdVar9 = pdVar9 + lVar28 + 1;
      local_130 = local_130 + lVar28 + 1;
      local_120 = local_120 + -0x10;
      local_128 = local_128 + -8;
      local_d0 = local_d0 + (ulong)uVar3;
      local_88 = local_88 + uVar15;
      local_74 = local_74 + iVar18;
      iVar18 = iVar18 + 2;
      local_7c = local_7c + iVar26;
      iVar26 = iVar26 + 2;
      local_110 = local_110 + uVar15;
      local_60 = CONCAT44(local_60._4_4_,iVar25 + -1);
      local_50 = uVar10;
    } while (pdVar5 != (double *)(ulong)uVar17);
  }
  return;
}

Assistant:

void
matrix_bidiagonalize (T const* mat_a, int rows, int cols, T* mat_u,
    T* mat_b, T* mat_v, T const& epsilon)
{
    /* Initialize U and V with identity matrices. */
    matrix_set_identity(mat_u, rows);
    matrix_set_identity(mat_v, cols);

    /* Copy mat_a into mat_b. */
    std::copy(mat_a, mat_a + rows * cols, mat_b);

    int const steps = (rows == cols) ? (cols - 1) : cols;
    for (int k = 0; k < steps; ++k)
    {
        int const sub_length = rows - k;
        std::vector<T> buffer(sub_length // input_vec
            + sub_length // house_vec
            + sub_length * sub_length // house_mat
            + rows * rows // update_u
            + rows * rows); // mat_u_tmp
        T* input_vec = &buffer[0];
        T* house_vec = input_vec + sub_length;
        T* house_mat = house_vec + sub_length;
        T house_beta;
        T* update_u = house_mat + sub_length * sub_length;
        T* mat_u_tmp = update_u + rows * rows;

        for (int i = 0; i < sub_length; ++i)
            input_vec[i] = mat_b[(k + i) * cols + k];

        matrix_householder_vector(input_vec, sub_length, house_vec,
            &house_beta, epsilon, T(1));
        matrix_householder_matrix(house_vec, sub_length,
            house_beta, house_mat);
        matrix_apply_householder_matrix(mat_b, rows, cols,
            house_mat, sub_length, k, k);

        for (int i = k + 1; i < rows; ++i)
            mat_b[i * cols + k] = T(0);

        /* Construct U update matrix and update U. */
        std::fill(update_u, update_u + rows * rows, T(0));
        for (int i = 0; i < k; ++i)
            update_u[i * rows + i] = T(1);
        for (int i = 0; i < sub_length; ++i)
        {
            for (int j = 0; j < sub_length; ++j)
            {
                update_u[(k + i) * rows + (k + j)] =
                    house_mat[i * sub_length + j];
            }
        }

        /* Copy matrix U for multiplication. */
        std::copy(mat_u, mat_u + rows * rows, mat_u_tmp);
        matrix_multiply(mat_u_tmp, rows, rows, update_u, rows, mat_u);

        if (k <= cols - 3)
        {
            /* Normalization constant for numerical stability. */
            T norm(0);
            for (int i = k + 1; i < cols; ++i)
                norm += mat_b[k * cols + i];
            if (MATH_EPSILON_EQ(norm, T(0), epsilon))
                norm = T(1);

            int const inner_sub_length = cols - (k + 1);
            int const slice_rows = rows - k;
            int const slice_cols = cols - k - 1;
            std::vector<T> buffer2(inner_sub_length // inner_input_vec
                + inner_sub_length // inner_house_vec
                + inner_sub_length * inner_sub_length // inner_house_mat
                + slice_rows * slice_cols // mat_b_res
                + slice_rows * slice_cols // mat_b_tmp
                + cols * cols // update_v
                + cols * cols); // mat_v_tmp

            T* inner_input_vec = &buffer2[0];
            T* inner_house_vec = inner_input_vec + inner_sub_length;
            T* inner_house_mat = inner_house_vec + inner_sub_length;
            T inner_house_beta;
            T* mat_b_res = inner_house_mat  + inner_sub_length * inner_sub_length;
            T* mat_b_tmp = mat_b_res + slice_rows * slice_cols;
            T* update_v = mat_b_tmp + slice_rows * slice_cols;
            T* mat_v_tmp = update_v + cols * cols;

            for (int i = 0; i < cols - k - 1; ++i)
                inner_input_vec[i] = mat_b[k * cols + (k + 1 + i)];

            matrix_householder_vector(inner_input_vec, inner_sub_length,
                inner_house_vec, &inner_house_beta, epsilon, norm);
            matrix_householder_matrix(inner_house_vec, inner_sub_length,
                inner_house_beta, inner_house_mat);

            /* Cut out mat_b(k:m, (k+1):n). */
            for (int i = 0; i < slice_rows; ++i)
            {
                for (int j = 0; j < slice_cols; ++j)
                {
                    mat_b_tmp[i * slice_cols + j] =
                        mat_b[(k + i) * cols + (k + 1 + j)];
                }
            }
            matrix_multiply(mat_b_tmp, slice_rows, slice_cols,
                inner_house_mat, inner_sub_length, mat_b_res);

            /* Write frame back into mat_b. */
            for (int i = 0; i < slice_rows; ++i)
            {
                for (int j = 0; j < slice_cols; ++j)
                {
                    mat_b[(k + i) * cols + (k + 1 + j)] =
                        mat_b_res[i * slice_cols + j];
                }
            }

            for (int i = k + 2; i < cols; ++i)
                mat_b[k * cols + i] = T(0);

            std::fill(update_v, update_v + cols * cols, T(0));
            for (int i = 0; i < k + 1; ++i)
                update_v[i * cols + i] = T(1);
            for (int i = 0; i < inner_sub_length; ++i)
            {
                for (int j = 0; j < inner_sub_length; ++j)
                {
                    update_v[(k + i + 1) * cols + (k + j + 1)] =
                        inner_house_mat[i * inner_sub_length + j];
                }
            }

            /* Copy matrix v for multiplication. */
            std::copy(mat_v, mat_v + cols * cols, mat_v_tmp);
            matrix_multiply(mat_v_tmp, cols, cols, update_v, cols, mat_v);
        }
    }
}